

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ConvolutionReverb.cpp
# Opt level: O0

void ConvolutionReverb::SetupImpulse(EffectData *data,int numchannels,int blocksize,int samplerate)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int index;
  int iVar15;
  IRSample *pIVar16;
  ulong uVar17;
  UnityComplexNumber *pUVar18;
  Channel *pCVar19;
  float *pfVar20;
  UnityComplexNumber **ppUVar21;
  double dVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  int local_1d4;
  int local_134;
  int n_9;
  double dc;
  float a;
  int n_8;
  double peak;
  double sum;
  int n_7;
  int k_1;
  float *src;
  int n_6;
  float scale;
  int n_5;
  float power;
  float tmp;
  int n_4;
  int len;
  float cut;
  float env_1;
  int n_3;
  float gain;
  float bpf;
  float lpf;
  float s2;
  float s1;
  int ipos2;
  int ipos1;
  float fpos;
  int n_2;
  float speed;
  int channel;
  int n_1;
  IRSample *s_1;
  int local_98;
  float env;
  int n;
  float d;
  float decayconst;
  float bw;
  float cutlo;
  float cuthi;
  Channel *c_1;
  int i_1;
  float sampletime;
  int impulsesamples;
  IRSample *s;
  int reallength;
  int k;
  Channel *c;
  int i;
  MutexScopeLock mutexScope2;
  Random local_2c;
  int usesample;
  Random random;
  MutexScopeLock mutexScope1;
  int samplerate_local;
  int blocksize_local;
  int numchannels_local;
  EffectData *data_local;
  
  MutexScopeLock::MutexScopeLock((MutexScopeLock *)&usesample,data->mutex,true);
  index = (int)data->p[9];
  if ((((((data->numchannels != numchannels) || (data->hopsize != blocksize)) ||
        (data->samplerate != samplerate)) ||
       ((data->lastparams[2] != data->p[2] || (NAN(data->lastparams[2]) || NAN(data->p[2]))))) ||
      ((((data->lastparams[3] != data->p[3] ||
         ((NAN(data->lastparams[3]) || NAN(data->p[3]) || (data->lastparams[4] != data->p[4])))) ||
        (NAN(data->lastparams[4]) || NAN(data->p[4]))) ||
       ((((data->lastparams[5] != data->p[5] || (NAN(data->lastparams[5]) || NAN(data->p[5]))) ||
         (data->lastparams[6] != data->p[6])) ||
        (((NAN(data->lastparams[6]) || NAN(data->p[6]) || (data->lastparams[7] != data->p[7])) ||
         ((NAN(data->lastparams[7]) || NAN(data->p[7]) ||
          ((data->lastparams[8] != data->p[8] || (NAN(data->lastparams[8]) || NAN(data->p[8]))))))))
        ))))) ||
     ((((int)data->lastparams[9] != index ||
       ((data->lastparams[10] != data->p[10] || (NAN(data->lastparams[10]) || NAN(data->p[10])))))
      || ((-1 < index && (pIVar16 = GetIRSample(index), pIVar16->updatecount != globalupdatecount)))
      ))) {
    MutexScopeLock::MutexScopeLock
              ((MutexScopeLock *)&stack0xffffffffffffffb8,(Mutex *)sampleMutex,true);
    for (c._4_4_ = 0; c._4_4_ < data->numchannels; c._4_4_ = c._4_4_ + 1) {
      pCVar19 = data->channels + c._4_4_;
      for (s._4_4_ = 0; s._4_4_ < data->numpartitions; s._4_4_ = s._4_4_ + 1) {
        if (pCVar19->h[s._4_4_] != (UnityComplexNumber *)0x0) {
          operator_delete__(pCVar19->h[s._4_4_]);
        }
        if (pCVar19->x[s._4_4_] != (UnityComplexNumber *)0x0) {
          operator_delete__(pCVar19->x[s._4_4_]);
        }
      }
      if (pCVar19->h != (UnityComplexNumber **)0x0) {
        operator_delete__(pCVar19->h);
      }
      if (pCVar19->x != (UnityComplexNumber **)0x0) {
        operator_delete__(pCVar19->x);
      }
      if (pCVar19->s != (float *)0x0) {
        operator_delete__(pCVar19->s);
      }
      if (pCVar19->impulse != (float *)0x0) {
        operator_delete__(pCVar19->impulse);
      }
    }
    if (data->channels != (Channel *)0x0) {
      operator_delete__(data->channels);
    }
    if (data->tmpoutput != (UnityComplexNumber *)0x0) {
      operator_delete__(data->tmpoutput);
    }
    uVar10 = *(undefined8 *)data->p;
    uVar11 = *(undefined8 *)(data->p + 2);
    uVar12 = *(undefined8 *)(data->p + 4);
    uVar13 = *(undefined8 *)(data->p + 6);
    uVar14 = *(undefined8 *)(data->p + 9);
    *(undefined8 *)(data->lastparams + 7) = *(undefined8 *)(data->p + 7);
    *(undefined8 *)(data->lastparams + 9) = uVar14;
    *(undefined8 *)(data->lastparams + 4) = uVar12;
    *(undefined8 *)(data->lastparams + 6) = uVar13;
    *(undefined8 *)data->lastparams = uVar10;
    *(undefined8 *)(data->lastparams + 2) = uVar11;
    data->bufferindex = 0;
    data->writeoffset = 0;
    data->numchannels = numchannels;
    data->hopsize = blocksize;
    data->fftsize = blocksize * 2;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)data->fftsize;
    uVar17 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar17 = 0xffffffffffffffff;
    }
    pUVar18 = (UnityComplexNumber *)operator_new__(uVar17);
    data->tmpoutput = pUVar18;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)data->numchannels;
    uVar17 = SUB168(auVar3 * ZEXT816(0x20),0);
    if (SUB168(auVar3 * ZEXT816(0x20),8) != 0) {
      uVar17 = 0xffffffffffffffff;
    }
    pCVar19 = (Channel *)operator_new__(uVar17);
    data->channels = pCVar19;
    data->samplerate = samplerate;
    memset(data->tmpoutput,0,(long)data->fftsize << 3);
    fVar23 = ceilf((float)samplerate * data->p[2]);
    s._0_4_ = (int)fVar23;
    if (-1 < index) {
      pIVar16 = GetIRSample(index);
      if (pIVar16->numsamples == 0) {
        s._0_4_ = 0x100;
      }
      else {
        fVar23 = ceilf(((float)pIVar16->numsamples * (float)samplerate) / (float)pIVar16->samplerate
                      );
        s._0_4_ = (int)fVar23;
      }
    }
    data->numpartitions = 0;
    while (data->numpartitions * data->hopsize < (int)s) {
      data->numpartitions = data->numpartitions + 1;
    }
    iVar15 = data->numpartitions * data->hopsize;
    for (c_1._4_4_ = 0; c_1._4_4_ < data->numchannels; c_1._4_4_ = c_1._4_4_ + 1) {
      pCVar19 = data->channels + c_1._4_4_;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (long)iVar15;
      uVar17 = SUB168(auVar4 * ZEXT816(4),0);
      if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
        uVar17 = 0xffffffffffffffff;
      }
      pfVar20 = (float *)operator_new__(uVar17);
      pCVar19->impulse = pfVar20;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (long)data->fftsize;
      uVar17 = SUB168(auVar5 * ZEXT816(4),0);
      if (SUB168(auVar5 * ZEXT816(4),8) != 0) {
        uVar17 = 0xffffffffffffffff;
      }
      pfVar20 = (float *)operator_new__(uVar17);
      pCVar19->s = pfVar20;
      memset(pCVar19->s,0,(long)data->fftsize << 2);
      fVar24 = sinf(data->p[6] * 0.7853982 * (1.0 / (float)samplerate));
      fVar25 = sinf(data->p[7] * 0.7853982 * (1.0 / (float)samplerate));
      fVar26 = data->p[8] * -0.89 + 0.9;
      fVar26 = fVar26 * fVar26;
      fVar23 = data->p[5];
      fVar27 = Random::GetFloat(&local_2c,0.0,0.01);
      fVar23 = (fVar23 * fVar27 + -1.0) / ((float)(int)s * 0.01 * data->p[3]);
      if (index < 0) {
        fVar27 = data->p[4];
        for (local_98 = 0; local_98 < iVar15; local_98 = local_98 + 1) {
          fVar28 = expf(fVar23 * (float)local_98);
          fVar29 = Random::GetFloat(&local_2c,0.1,1.0);
          fVar29 = powf(fVar29,fVar27 * -0.09 + 10.0);
          fVar30 = Random::GetFloat(&local_2c,-1.0,1.0);
          pCVar19->impulse[local_98] = fVar28 * fVar29 * fVar30;
        }
      }
      else {
        pIVar16 = GetIRSample(index);
        if (pIVar16->numsamples == 0) {
          SetupImpulse::dummysample.data = SetupImpulse::dummydata;
          SetupImpulse::dummysample.numsamples = 0x100;
          SetupImpulse::dummysample.numchannels = numchannels;
          SetupImpulse::dummysample.samplerate = samplerate;
          for (speed = 0.0; (int)speed < numchannels; speed = (float)((int)speed + 1)) {
            SetupImpulse::dummydata[(int)speed] = 1.0;
          }
          memcpy(pIVar16,&SetupImpulse::dummysample,0x420);
        }
        if (c_1._4_4_ < numchannels) {
          local_1d4 = c_1._4_4_;
        }
        else {
          local_1d4 = numchannels + -1;
        }
        iVar1 = pIVar16->samplerate;
        for (ipos1 = 0; ipos1 < iVar15; ipos1 = ipos1 + 1) {
          fVar27 = (float)ipos1 * ((float)iVar1 / (float)samplerate);
          fVar28 = ceilf(fVar27);
          s1 = (float)(int)fVar28;
          if (pIVar16->numsamples <= (int)s1) {
            s1 = (float)(pIVar16->numsamples + -1);
          }
          s2 = (float)((int)s1 + 1);
          if (pIVar16->numsamples <= (int)s2) {
            s2 = (float)(pIVar16->numsamples + -1);
          }
          pCVar19->impulse[ipos1] =
               (pIVar16->data[(int)s2 * pIVar16->numchannels + local_1d4] -
               pIVar16->data[(int)s1 * pIVar16->numchannels + local_1d4]) *
               (fVar27 - (float)(int)s1) + pIVar16->data[(int)s1 * pIVar16->numchannels + local_1d4]
          ;
        }
        pIVar16->updatecount = globalupdatecount;
      }
      gain = 0.0;
      n_3 = 0;
      for (cut = 0.0; (int)cut < iVar15; cut = (float)((int)cut + 1)) {
        fVar27 = expf(fVar23 * (float)(int)cut);
        fVar27 = ((fVar24 + fVar24) - (fVar25 + fVar25)) * fVar27 + fVar25 + fVar25;
        fVar28 = fVar27 * (float)n_3 + gain;
        fVar29 = fVar27 * (-(float)n_3 * fVar26 + (pCVar19->impulse[(int)cut] - fVar28)) +
                 (float)n_3;
        gain = fVar27 * fVar29 + fVar28;
        n_3 = (int)(-fVar27 * (fVar29 * fVar26 + gain) + fVar29);
        pCVar19->impulse[(int)cut] = (-fVar26 * fVar26 + 1.0) * 0.5 * gain;
      }
      if (0.5 < data->p[10]) {
        for (power = 0.0; (int)power < iVar15 >> 1; power = (float)((int)power + 1)) {
          fVar23 = pCVar19->impulse[(int)power];
          pCVar19->impulse[(int)power] = pCVar19->impulse[(iVar15 + -1) - (int)power];
          pCVar19->impulse[(iVar15 + -1) - (int)power] = fVar23;
        }
      }
      scale = 0.0;
      for (n_6 = 0; n_6 < iVar15; n_6 = n_6 + 1) {
        scale = pCVar19->impulse[n_6] * pCVar19->impulse[n_6] + scale;
      }
      fVar23 = sqrtf(scale);
      for (src._0_4_ = 0; (int)src < iVar15; src._0_4_ = (int)src + 1) {
        pCVar19->impulse[(int)src] = (1.0 / fVar23) * pCVar19->impulse[(int)src];
      }
      auVar6._8_8_ = 0;
      auVar6._0_8_ = (long)data->numpartitions;
      uVar17 = SUB168(auVar6 * ZEXT816(8),0);
      if (SUB168(auVar6 * ZEXT816(8),8) != 0) {
        uVar17 = 0xffffffffffffffff;
      }
      ppUVar21 = (UnityComplexNumber **)operator_new__(uVar17);
      pCVar19->h = ppUVar21;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = (long)data->numpartitions;
      uVar17 = SUB168(auVar7 * ZEXT816(8),0);
      if (SUB168(auVar7 * ZEXT816(8),8) != 0) {
        uVar17 = 0xffffffffffffffff;
      }
      ppUVar21 = (UnityComplexNumber **)operator_new__(uVar17);
      pCVar19->x = ppUVar21;
      _n_7 = pCVar19->impulse;
      for (sum._4_4_ = 0; sum._4_4_ < data->numpartitions; sum._4_4_ = sum._4_4_ + 1) {
        auVar8._8_8_ = 0;
        auVar8._0_8_ = (long)data->fftsize;
        uVar17 = SUB168(auVar8 * ZEXT816(8),0);
        if (SUB168(auVar8 * ZEXT816(8),8) != 0) {
          uVar17 = 0xffffffffffffffff;
        }
        pUVar18 = (UnityComplexNumber *)operator_new__(uVar17);
        pCVar19->h[sum._4_4_] = pUVar18;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = (long)data->fftsize;
        uVar17 = SUB168(auVar9 * ZEXT816(8),0);
        if (SUB168(auVar9 * ZEXT816(8),8) != 0) {
          uVar17 = 0xffffffffffffffff;
        }
        pUVar18 = (UnityComplexNumber *)operator_new__(uVar17);
        pCVar19->x[sum._4_4_] = pUVar18;
        memset(pCVar19->x[sum._4_4_],0,(long)data->fftsize << 3);
        memset(pCVar19->h[sum._4_4_],0,(long)data->fftsize << 3);
        for (sum._0_4_ = 0; sum._0_4_ < data->hopsize; sum._0_4_ = sum._0_4_ + 1) {
          pCVar19->h[sum._4_4_][sum._0_4_].re = *_n_7;
          _n_7 = _n_7 + 1;
        }
        FFT::Forward(pCVar19->h[sum._4_4_],data->fftsize,false);
      }
      peak = 0.0;
      _a = 0.0;
      for (dc._4_4_ = 0; dc._4_4_ < iVar15; dc._4_4_ = dc._4_4_ + 1) {
        if ((double)ABS(pCVar19->impulse[dc._4_4_]) <= _a) {
          _a = _a * 0.9900000095367432 + 9.999999717180685e-10;
        }
        else {
          _a = (double)ABS(pCVar19->impulse[dc._4_4_]);
        }
        peak = _a + peak;
        pCVar19->impulse[dc._4_4_] = (float)peak;
      }
      dVar22 = -peak;
      peak = 0.0;
      for (local_134 = 0; local_134 < iVar15; local_134 = local_134 + 1) {
        pCVar19->impulse[local_134] = pCVar19->impulse[local_134] - (float)peak;
        peak = peak - dVar22 / (double)iVar15;
      }
    }
    MutexScopeLock::~MutexScopeLock((MutexScopeLock *)&stack0xffffffffffffffb8);
    mutexScope2.mutex._0_4_ = 0;
  }
  else {
    mutexScope2.mutex._0_4_ = 1;
  }
  MutexScopeLock::~MutexScopeLock((MutexScopeLock *)&usesample);
  return;
}

Assistant:

static void SetupImpulse(EffectData* data, int numchannels, int blocksize, int samplerate)
    {
        MutexScopeLock mutexScope1(*data->mutex);

        Random random;

        int usesample = (int)data->p[P_USESAMPLE];

        // if no parameters have changed, there's no need to recalculate the impulse
        if (data->numchannels == numchannels &&
            data->hopsize == blocksize &&
            data->samplerate == samplerate &&
            data->lastparams[P_TIME] == data->p[P_TIME] &&
            data->lastparams[P_DECAY] == data->p[P_DECAY] &&
            data->lastparams[P_DIFFUSION] == data->p[P_DIFFUSION] &&
            data->lastparams[P_STEREO] == data->p[P_STEREO] &&
            data->lastparams[P_CUTHI] == data->p[P_CUTHI] &&
            data->lastparams[P_CUTLO] == data->p[P_CUTLO] &&
            data->lastparams[P_RESONANCE] == data->p[P_RESONANCE] &&
            (int)data->lastparams[P_USESAMPLE] == usesample &&
            data->lastparams[P_REVERSE] == data->p[P_REVERSE] &&
            (usesample < 0 || GetIRSample(usesample).updatecount == globalupdatecount)
            )
            return;

        MutexScopeLock mutexScope2(sampleMutex);

        // delete old buffers (can be avoided if numchannels, numpartitions and hopsize stay the same)
        for (int i = 0; i < data->numchannels; i++)
        {
            Channel& c = data->channels[i];
            for (int k = 0; k < data->numpartitions; k++)
            {
                delete[] c.h[k];
                delete[] c.x[k];
            }
            delete[] c.h;
            delete[] c.x;
            delete[] c.s;
            delete[] c.impulse;
        }
        delete[] data->channels;
        delete[] data->tmpoutput;

        memcpy(data->lastparams, data->p, sizeof(data->p));

        // reinitialize data
        data->bufferindex = 0;
        data->writeoffset = 0;
        data->numchannels = numchannels;
        data->hopsize = blocksize;
        data->fftsize = blocksize * 2;
        data->tmpoutput = new UnityComplexNumber[data->fftsize];
        data->channels = new Channel[data->numchannels];
        data->samplerate = samplerate;

        memset(data->tmpoutput, 0, sizeof(UnityComplexNumber) * data->fftsize);

        // calculate length of impulse in samples
        int reallength = (int)ceilf(samplerate * data->p[P_TIME]);
        if (usesample >= 0)
        {
            IRSample& s = GetIRSample(usesample);
            if (s.numsamples == 0)
                reallength = 256;
            else
                reallength = (int)ceilf(s.numsamples * (float)samplerate / (float)s.samplerate);
        }

        // calculate length of impulse in samples as a multiple of the number of partitions processed
        data->numpartitions = 0;
        while (data->numpartitions * data->hopsize < reallength)
            data->numpartitions++;
        int impulsesamples = data->numpartitions * data->hopsize;

        // calculate individual impulse responses per channel
        float sampletime = 1.0f / (float)samplerate;
        for (int i = 0; i < data->numchannels; i++)
        {
            Channel& c = data->channels[i];
            c.impulse = new float[impulsesamples];
            c.s = new float[data->fftsize];
            memset(c.s, 0, sizeof(float) * data->fftsize);

            float cuthi = 2.0f * sinf(0.25f * kPI * data->p[P_CUTHI] * sampletime);
            float cutlo = 2.0f * sinf(0.25f * kPI * data->p[P_CUTLO] * sampletime);
            float bw = 0.9f - 0.89f * data->p[P_RESONANCE]; bw *= bw;
            float decayconst = (data->p[P_STEREO] * random.GetFloat(0.0f, 0.01f) - 1.0f) / (reallength * 0.01f * data->p[P_DECAY]);

            if (usesample < 0)
            {
                // calculate the impulse response as decaying white noise
                float d = 10.0f - 0.09f * data->p[P_DIFFUSION];
                for (int n = 0; n < impulsesamples; n++)
                {
                    float env = expf(decayconst * n);
                    c.impulse[n] = env * powf(random.GetFloat(0.1f, 1.0f), d) * random.GetFloat(-1.0f, 1.0f);
                }
            }
            else
            {
                IRSample& s = GetIRSample(usesample);
                if (s.numsamples == 0)
                {
                    static float dummydata[256 * 8];
                    static IRSample dummysample;
                    dummysample.data = dummydata;
                    dummysample.numchannels = numchannels;
                    dummysample.numsamples = 256;
                    dummysample.samplerate = samplerate;
                    for (int n = 0; n < numchannels; n++)
                        dummydata[n] = 1.0f;
                    s = dummysample;
                }

                int channel = (i < numchannels) ? i : (numchannels - 1);
                float speed = (float)s.samplerate / (float)samplerate;
                for (int n = 0; n < impulsesamples; n++)
                {
                    float fpos = n * speed;
                    int ipos1 = (int)ceilf(fpos);
                    if (ipos1 >= s.numsamples)
                        ipos1 = s.numsamples - 1;
                    int ipos2 = ipos1 + 1;
                    if (ipos2 >= s.numsamples)
                        ipos2 = s.numsamples - 1;
                    fpos -= ipos1;
                    float s1 = s.data[ipos1 * s.numchannels + channel];
                    float s2 = s.data[ipos2 * s.numchannels + channel];
                    c.impulse[n] = s1 + (s2 - s1) * fpos;
                }

                s.updatecount = globalupdatecount;
            }

            float lpf = 0.0f, bpf = 0.0f, gain = 0.5f * (1.0f - bw * bw);
            for (int n = 0; n < impulsesamples; n++)
            {
                float env = expf(decayconst * n);
                float cut = cutlo + (cuthi - cutlo) * env;
                lpf += cut * bpf;
                bpf += cut * (c.impulse[n] - lpf - bpf * bw);
                lpf += cut * bpf;
                bpf -= cut * (lpf + bpf * bw);
                c.impulse[n] = gain * lpf;
                //c.impulse[n] = env * sinf(n * 2.0f * 3.1415926f * 1000.0f / 44100.0f); // damped sine -- useful for debugging with click input signals
            }

            if (data->p[P_REVERSE] > 0.5f)
            {
                int len = impulsesamples >> 1;
                for (int n = 0; n < len; n++)
                {
                    float tmp = c.impulse[n];
                    c.impulse[n] = c.impulse[impulsesamples - 1 - n];
                    c.impulse[impulsesamples - 1 - n] = tmp;
                }
            }

            // measure signal power
            float power = 0.0f;
            for (int n = 0; n < impulsesamples; n++)
                power += c.impulse[n] * c.impulse[n];

            // normalize gain
            float scale = 1.0f / sqrtf(power);
            for (int n = 0; n < impulsesamples; n++)
                c.impulse[n] *= scale;

            // partition the impulse response
            c.h = new UnityComplexNumber*[data->numpartitions];
            c.x = new UnityComplexNumber*[data->numpartitions];
            float* src = c.impulse;
            for (int k = 0; k < data->numpartitions; k++)
            {
                c.h[k] = new UnityComplexNumber[data->fftsize];
                c.x[k] = new UnityComplexNumber[data->fftsize];
                memset(c.x[k], 0, sizeof(UnityComplexNumber) * data->fftsize);
                memset(c.h[k], 0, sizeof(UnityComplexNumber) * data->fftsize);
                for (int n = 0; n < data->hopsize; n++)
                    c.h[k][n].re = *src++;
                FFT::Forward(c.h[k], data->fftsize, false);
            }

            // integrate peak detection filtered impulse for later resampling via box-filtering when GUI requests preview waveform
            double sum = 0.0, peak = 0.0;
            for (int n = 0; n < impulsesamples; n++)
            {
                float a = fabsf(c.impulse[n]);
                if (a > peak)
                    peak = a;
                else
                    peak = peak * 0.99f + 1.0e-9f;
                sum += peak;
                c.impulse[n] = (float)sum;
            }
            double dc = -sum / (double)impulsesamples;
            sum = 0.0;
            for (int n = 0; n < impulsesamples; n++)
            {
                c.impulse[n] -= (float)sum;
                sum -= dc;
            }
        }
    }